

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::CreateNewInstanceFromIterator
              (RecyclableObject *iterator,ScriptContext *scriptContext,uint32 elementSize,
              PFNCreateTypedArray pfnCreateTypedArray)

{
  uint32 uVar1;
  TypedArrayBase *pTVar2;
  bool bVar3;
  JavascriptLibrary *pJVar4;
  ArrayBuffer *pAVar5;
  Type *ppvVar6;
  Var kValue;
  uint32 k;
  ArrayBufferBase *arrayBuffer;
  uint32 byteLen;
  uint32 len;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *tempList;
  ArenaAllocator *tempAlloc;
  TempGuestArenaAllocatorObject *tempGuesttempAlloc;
  TypedArrayBase *newArr;
  PFNCreateTypedArray pfnCreateTypedArray_local;
  ScriptContext *pSStack_18;
  uint32 elementSize_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  tempGuesttempAlloc = (TempGuestArenaAllocatorObject *)0x0;
  tempAlloc = (ArenaAllocator *)0x0;
  tempList = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
             0x0;
  newArr = (TypedArrayBase *)pfnCreateTypedArray;
  pfnCreateTypedArray_local._4_4_ = elementSize;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)iterator;
  tempAlloc = (ArenaAllocator *)ScriptContext::GetTemporaryGuestAllocator(scriptContext,L"Runtime");
  tempList = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
             TempArenaAllocatorWrapper<true>::GetAllocator
                       ((TempArenaAllocatorWrapper<true> *)tempAlloc);
  _byteLen = IteratorToList((RecyclableObject *)scriptContext_local,pSStack_18,
                            (ArenaAllocator *)tempList);
  arrayBuffer._4_4_ =
       JsUtil::ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                 (&_byteLen->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>);
  bVar3 = UInt32Math::Mul(arrayBuffer._4_4_,pfnCreateTypedArray_local._4_4_,(uint32 *)&arrayBuffer);
  if (!bVar3) {
    pJVar4 = ScriptContext::GetLibrary(pSStack_18);
    pAVar5 = JavascriptLibrary::CreateArrayBuffer(pJVar4,(uint32)arrayBuffer);
    pTVar2 = newArr;
    uVar1 = arrayBuffer._4_4_;
    pJVar4 = ScriptContext::GetLibrary(pSStack_18);
    tempGuesttempAlloc = (TempGuestArenaAllocatorObject *)(*(code *)pTVar2)(pAVar5,0,uVar1,pJVar4);
    for (kValue._4_4_ = 0; kValue._4_4_ < arrayBuffer._4_4_; kValue._4_4_ = kValue._4_4_ + 1) {
      ppvVar6 = JsUtil::
                List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
                Item(_byteLen,kValue._4_4_);
      (*(tempGuesttempAlloc->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x29])(tempGuesttempAlloc,(ulong)kValue._4_4_,*ppvVar6,0);
    }
    if (tempAlloc != (ArenaAllocator *)0x0) {
      ScriptContext::ReleaseTemporaryGuestAllocator
                (pSStack_18,(TempGuestArenaAllocatorObject *)tempAlloc);
    }
    return tempGuesttempAlloc;
  }
  JavascriptError::ThrowRangeError(pSStack_18,-0x7ff5ec24,(PCWSTR)0x0);
}

Assistant:

Var TypedArrayBase::CreateNewInstanceFromIterator(RecyclableObject *iterator, ScriptContext *scriptContext, uint32 elementSize, PFNCreateTypedArray pfnCreateTypedArray)
    {
        TypedArrayBase *newArr = nullptr;

        DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

        ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
        {
            JsUtil::List<Var, ArenaAllocator>* tempList = IteratorToList(iterator, scriptContext, tempAlloc);

            uint32 len = tempList->Count();
            uint32 byteLen;

            if (UInt32Math::Mul(len, elementSize, &byteLen))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayLength);
            }

            ArrayBufferBase *arrayBuffer = scriptContext->GetLibrary()->CreateArrayBuffer(byteLen);
            newArr = static_cast<TypedArrayBase*>(pfnCreateTypedArray(arrayBuffer, 0, len, scriptContext->GetLibrary()));

            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = tempList->Item(k);
                newArr->SetItem(k, kValue);
            }
        }
        RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);

        return newArr;
    }